

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_perform_upgrade_tls(connectdata *conn)

{
  _Bool *done;
  CURLcode CVar1;
  
  done = &(conn->proto).imapc.ssldone;
  CVar1 = Curl_ssl_connect_nonblocking(conn,0,done);
  if (CVar1 == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_AUTHENTICATE) {
      (conn->proto).imapc.state = IMAP_AUTHENTICATE;
    }
    CVar1 = CURLE_OK;
    if (*done == true) {
      conn->handler = &Curl_handler_smtps;
      conn->tls_upgraded = true;
      CVar1 = smtp_perform_ehlo(conn);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &smtpc->ssldone);

  if(!result) {
    if(smtpc->state != SMTP_UPGRADETLS)
      state(conn, SMTP_UPGRADETLS);

    if(smtpc->ssldone) {
      smtp_to_smtps(conn);
      result = smtp_perform_ehlo(conn);
    }
  }

  return result;
}